

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::LayerParameter::Clear(LayerParameter *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  TransformationParameter *this_00;
  LossParameter *this_01;
  AccuracyParameter *this_02;
  ArgMaxParameter *this_03;
  ConcatParameter *this_04;
  ContrastiveLossParameter *this_05;
  ConvolutionParameter *this_06;
  DataParameter *this_07;
  DropoutParameter *pDVar4;
  DummyDataParameter *this_08;
  EltwiseParameter *this_09;
  ExpParameter *this_10;
  HDF5DataParameter *this_11;
  HDF5OutputParameter *this_12;
  HingeLossParameter *pHVar5;
  ImageDataParameter *this_13;
  InfogainLossParameter *this_14;
  InnerProductParameter *this_15;
  LRNParameter *this_16;
  MemoryDataParameter *this_17;
  MVNParameter *this_18;
  PoolingParameter *this_19;
  PowerParameter *this_20;
  ReLUParameter *this_21;
  SigmoidParameter *pSVar6;
  SoftmaxParameter *this_22;
  SliceParameter *this_23;
  TanHParameter *pTVar7;
  ThresholdParameter *pTVar8;
  WindowDataParameter *this_24;
  PythonParameter *this_25;
  PReLUParameter *this_26;
  SPPParameter *this_27;
  ReshapeParameter *this_28;
  LogParameter *this_29;
  FlattenParameter *this_30;
  ReductionParameter *this_31;
  EmbedParameter *this_32;
  TileParameter *this_33;
  BatchNormParameter *this_34;
  ELUParameter *pEVar9;
  BiasParameter *this_35;
  ScaleParameter *this_36;
  InputParameter *this_37;
  CropParameter *pCVar10;
  ParameterParameter *this_38;
  RecurrentParameter *this_39;
  LogFinisher local_51;
  LogMessage local_50;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase);
  (this->loss_weight_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase);
  (this->propagate_down_).current_size_ = 0;
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->name_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x31fb);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->name_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = (this->type_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x31ff);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->type_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 4) != 0) {
      this_00 = this->transform_param_;
      if (this_00 == (TransformationParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3203);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: transform_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_00 = this->transform_param_;
      }
      TransformationParameter::Clear(this_00);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 8) != 0) {
      this_01 = this->loss_param_;
      if (this_01 == (LossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3207);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_01 = this->loss_param_;
      }
      LossParameter::Clear(this_01);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x10) != 0) {
      this_02 = this->accuracy_param_;
      if (this_02 == (AccuracyParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x320b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: accuracy_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_02 = this->accuracy_param_;
      }
      AccuracyParameter::Clear(this_02);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x20) != 0) {
      this_03 = this->argmax_param_;
      if (this_03 == (ArgMaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x320f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: argmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_03 = this->argmax_param_;
      }
      ArgMaxParameter::Clear(this_03);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x40) != 0) {
      this_04 = this->concat_param_;
      if (this_04 == (ConcatParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3213);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: concat_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_04 = this->concat_param_;
      }
      ConcatParameter::Clear(this_04);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((char)uVar1 < '\0') {
      this_05 = this->contrastive_loss_param_;
      if (this_05 == (ContrastiveLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3217);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: contrastive_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_05 = this->contrastive_loss_param_;
      }
      ContrastiveLossParameter::Clear(this_05);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      this_06 = this->convolution_param_;
      if (this_06 == (ConvolutionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x321d);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: convolution_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_06 = this->convolution_param_;
      }
      ConvolutionParameter::Clear(this_06);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 9 & 1) != 0) {
      this_07 = this->data_param_;
      if (this_07 == (DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3221);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_07 = this->data_param_;
      }
      DataParameter::Clear(this_07);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 10 & 1) != 0) {
      pDVar4 = this->dropout_param_;
      if (pDVar4 == (DropoutParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3225);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: dropout_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pDVar4 = this->dropout_param_;
      }
      pDVar4->dropout_ratio_ = 0.5;
      (pDVar4->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pDVar4->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pDVar4->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    if ((uVar1 >> 0xb & 1) != 0) {
      this_08 = this->dummy_data_param_;
      if (this_08 == (DummyDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3229);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: dummy_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_08 = this->dummy_data_param_;
      }
      DummyDataParameter::Clear(this_08);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      this_09 = this->eltwise_param_;
      if (this_09 == (EltwiseParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x322d);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: eltwise_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_09 = this->eltwise_param_;
      }
      EltwiseParameter::Clear(this_09);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      this_10 = this->exp_param_;
      if (this_10 == (ExpParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3231);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: exp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_10 = this->exp_param_;
      }
      ExpParameter::Clear(this_10);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      this_11 = this->hdf5_data_param_;
      if (this_11 == (HDF5DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3235);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: hdf5_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_11 = this->hdf5_data_param_;
      }
      HDF5DataParameter::Clear(this_11);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((short)uVar1 < 0) {
      this_12 = this->hdf5_output_param_;
      if (this_12 == (HDF5OutputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3239);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: hdf5_output_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_12 = this->hdf5_output_param_;
      }
      HDF5OutputParameter::Clear(this_12);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      pHVar5 = this->hinge_loss_param_;
      if (pHVar5 == (HingeLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x323f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: hinge_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pHVar5 = this->hinge_loss_param_;
      }
      pHVar5->norm_ = 1;
      (pHVar5->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pHVar5->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pHVar5->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    if ((uVar1 >> 0x11 & 1) != 0) {
      this_13 = this->image_data_param_;
      if (this_13 == (ImageDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3243);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: image_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_13 = this->image_data_param_;
      }
      ImageDataParameter::Clear(this_13);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      this_14 = this->infogain_loss_param_;
      if (this_14 == (InfogainLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3247);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: infogain_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_14 = this->infogain_loss_param_;
      }
      InfogainLossParameter::Clear(this_14);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      this_15 = this->inner_product_param_;
      if (this_15 == (InnerProductParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x324b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: inner_product_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_15 = this->inner_product_param_;
      }
      InnerProductParameter::Clear(this_15);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x14 & 1) != 0) {
      this_16 = this->lrn_param_;
      if (this_16 == (LRNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x324f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: lrn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_16 = this->lrn_param_;
      }
      LRNParameter::Clear(this_16);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x15 & 1) != 0) {
      this_17 = this->memory_data_param_;
      if (this_17 == (MemoryDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3253);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: memory_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_17 = this->memory_data_param_;
      }
      MemoryDataParameter::Clear(this_17);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x16 & 1) != 0) {
      this_18 = this->mvn_param_;
      if (this_18 == (MVNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3257);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: mvn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_18 = this->mvn_param_;
      }
      MVNParameter::Clear(this_18);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x17 & 1) != 0) {
      this_19 = this->pooling_param_;
      if (this_19 == (PoolingParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x325b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: pooling_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_19 = this->pooling_param_;
      }
      PoolingParameter::Clear(this_19);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if (0xffffff < uVar1) {
    if ((uVar1 >> 0x18 & 1) != 0) {
      this_20 = this->power_param_;
      if (this_20 == (PowerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3261);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: power_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_20 = this->power_param_;
      }
      PowerParameter::Clear(this_20);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x19 & 1) != 0) {
      this_21 = this->relu_param_;
      if (this_21 == (ReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3265);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: relu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_21 = this->relu_param_;
      }
      ReLUParameter::Clear(this_21);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x1a & 1) != 0) {
      pSVar6 = this->sigmoid_param_;
      if (pSVar6 == (SigmoidParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3269);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: sigmoid_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pSVar6 = this->sigmoid_param_;
      }
      pSVar6->engine_ = 0;
      (pSVar6->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pSVar6->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pSVar6->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    if ((uVar1 >> 0x1b & 1) != 0) {
      this_22 = this->softmax_param_;
      if (this_22 == (SoftmaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x326d);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: softmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_22 = this->softmax_param_;
      }
      SoftmaxParameter::Clear(this_22);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x1c & 1) != 0) {
      this_23 = this->slice_param_;
      if (this_23 == (SliceParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3271);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: slice_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_23 = this->slice_param_;
      }
      SliceParameter::Clear(this_23);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x1d & 1) != 0) {
      pTVar7 = this->tanh_param_;
      if (pTVar7 == (TanHParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3275);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: tanh_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pTVar7 = this->tanh_param_;
      }
      pTVar7->engine_ = 0;
      (pTVar7->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pTVar7->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pTVar7->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    if ((uVar1 >> 0x1e & 1) != 0) {
      pTVar8 = this->threshold_param_;
      if (pTVar8 == (ThresholdParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3279);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: threshold_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pTVar8 = this->threshold_param_;
      }
      pTVar8->threshold_ = 0.0;
      (pTVar8->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pTVar8->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pTVar8->_internal_metadata_)
        ;
      }
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((int)uVar1 < 0) {
      this_24 = this->window_data_param_;
      if (this_24 == (WindowDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x327d);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: window_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_24 = this->window_data_param_;
      }
      WindowDataParameter::Clear(this_24);
    }
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      this_25 = this->python_param_;
      if (this_25 == (PythonParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3283);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: python_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_25 = this->python_param_;
      }
      PythonParameter::Clear(this_25);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 & 2) != 0) {
      this_26 = this->prelu_param_;
      if (this_26 == (PReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3287);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: prelu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_26 = this->prelu_param_;
      }
      PReLUParameter::Clear(this_26);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 & 4) != 0) {
      this_27 = this->spp_param_;
      if (this_27 == (SPPParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x328b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: spp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_27 = this->spp_param_;
      }
      SPPParameter::Clear(this_27);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 & 8) != 0) {
      this_28 = this->reshape_param_;
      if (this_28 == (ReshapeParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x328f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: reshape_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_28 = this->reshape_param_;
      }
      ReshapeParameter::Clear(this_28);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 & 0x10) != 0) {
      this_29 = this->log_param_;
      if (this_29 == (LogParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3293);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: log_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_29 = this->log_param_;
      }
      LogParameter::Clear(this_29);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 & 0x20) != 0) {
      this_30 = this->flatten_param_;
      if (this_30 == (FlattenParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3297);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: flatten_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_30 = this->flatten_param_;
      }
      FlattenParameter::Clear(this_30);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 & 0x40) != 0) {
      this_31 = this->reduction_param_;
      if (this_31 == (ReductionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x329b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: reduction_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_31 = this->reduction_param_;
      }
      ReductionParameter::Clear(this_31);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((char)uVar1 < '\0') {
      this_32 = this->embed_param_;
      if (this_32 == (EmbedParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x329f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: embed_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_32 = this->embed_param_;
      }
      EmbedParameter::Clear(this_32);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      this_33 = this->tile_param_;
      if (this_33 == (TileParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32a5);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: tile_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_33 = this->tile_param_;
      }
      TileParameter::Clear(this_33);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 >> 9 & 1) != 0) {
      this_34 = this->batch_norm_param_;
      if (this_34 == (BatchNormParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32a9);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: batch_norm_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_34 = this->batch_norm_param_;
      }
      BatchNormParameter::Clear(this_34);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 >> 10 & 1) != 0) {
      pEVar9 = this->elu_param_;
      if (pEVar9 == (ELUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32ad);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: elu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pEVar9 = this->elu_param_;
      }
      pEVar9->alpha_ = 1.0;
      (pEVar9->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pEVar9->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pEVar9->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[1];
    if ((uVar1 >> 0xb & 1) != 0) {
      this_35 = this->bias_param_;
      if (this_35 == (BiasParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b1);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: bias_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_35 = this->bias_param_;
      }
      BiasParameter::Clear(this_35);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      this_36 = this->scale_param_;
      if (this_36 == (ScaleParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b5);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: scale_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_36 = this->scale_param_;
      }
      ScaleParameter::Clear(this_36);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      this_37 = this->input_param_;
      if (this_37 == (InputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b9);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: input_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_37 = this->input_param_;
      }
      InputParameter::Clear(this_37);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      pCVar10 = this->crop_param_;
      if (pCVar10 == (CropParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32bd);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: crop_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pCVar10 = this->crop_param_;
      }
      (pCVar10->offset_).current_size_ = 0;
      pCVar10->axis_ = 2;
      (pCVar10->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pCVar10->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear
                  (&pCVar10->_internal_metadata_);
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[1];
    if ((short)uVar1 < 0) {
      this_38 = this->parameter_param_;
      if (this_38 == (ParameterParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32c1);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: parameter_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_38 = this->parameter_param_;
      }
      ParameterParameter::Clear(this_38);
      uVar1 = (this->_has_bits_).has_bits_[1];
    }
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    this_39 = this->recurrent_param_;
    if (this_39 == (RecurrentParameter *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x32c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: recurrent_param_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_50);
      this_39 = this->recurrent_param_;
    }
    RecurrentParameter::Clear(this_39);
  }
  this->phase_ = 0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void LayerParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.LayerParameter)
  bottom_.Clear();
  top_.Clear();
  loss_weight_.Clear();
  param_.Clear();
  blobs_.Clear();
  include_.Clear();
  exclude_.Clear();
  propagate_down_.Clear();
  if (_has_bits_[0 / 32] & 255u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_type()) {
      GOOGLE_DCHECK(!type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*type_.UnsafeRawStringPointer())->clear();
    }
    if (has_transform_param()) {
      GOOGLE_DCHECK(transform_param_ != NULL);
      transform_param_->::caffe::TransformationParameter::Clear();
    }
    if (has_loss_param()) {
      GOOGLE_DCHECK(loss_param_ != NULL);
      loss_param_->::caffe::LossParameter::Clear();
    }
    if (has_accuracy_param()) {
      GOOGLE_DCHECK(accuracy_param_ != NULL);
      accuracy_param_->::caffe::AccuracyParameter::Clear();
    }
    if (has_argmax_param()) {
      GOOGLE_DCHECK(argmax_param_ != NULL);
      argmax_param_->::caffe::ArgMaxParameter::Clear();
    }
    if (has_concat_param()) {
      GOOGLE_DCHECK(concat_param_ != NULL);
      concat_param_->::caffe::ConcatParameter::Clear();
    }
    if (has_contrastive_loss_param()) {
      GOOGLE_DCHECK(contrastive_loss_param_ != NULL);
      contrastive_loss_param_->::caffe::ContrastiveLossParameter::Clear();
    }
  }
  if (_has_bits_[8 / 32] & 65280u) {
    if (has_convolution_param()) {
      GOOGLE_DCHECK(convolution_param_ != NULL);
      convolution_param_->::caffe::ConvolutionParameter::Clear();
    }
    if (has_data_param()) {
      GOOGLE_DCHECK(data_param_ != NULL);
      data_param_->::caffe::DataParameter::Clear();
    }
    if (has_dropout_param()) {
      GOOGLE_DCHECK(dropout_param_ != NULL);
      dropout_param_->::caffe::DropoutParameter::Clear();
    }
    if (has_dummy_data_param()) {
      GOOGLE_DCHECK(dummy_data_param_ != NULL);
      dummy_data_param_->::caffe::DummyDataParameter::Clear();
    }
    if (has_eltwise_param()) {
      GOOGLE_DCHECK(eltwise_param_ != NULL);
      eltwise_param_->::caffe::EltwiseParameter::Clear();
    }
    if (has_exp_param()) {
      GOOGLE_DCHECK(exp_param_ != NULL);
      exp_param_->::caffe::ExpParameter::Clear();
    }
    if (has_hdf5_data_param()) {
      GOOGLE_DCHECK(hdf5_data_param_ != NULL);
      hdf5_data_param_->::caffe::HDF5DataParameter::Clear();
    }
    if (has_hdf5_output_param()) {
      GOOGLE_DCHECK(hdf5_output_param_ != NULL);
      hdf5_output_param_->::caffe::HDF5OutputParameter::Clear();
    }
  }
  if (_has_bits_[16 / 32] & 16711680u) {
    if (has_hinge_loss_param()) {
      GOOGLE_DCHECK(hinge_loss_param_ != NULL);
      hinge_loss_param_->::caffe::HingeLossParameter::Clear();
    }
    if (has_image_data_param()) {
      GOOGLE_DCHECK(image_data_param_ != NULL);
      image_data_param_->::caffe::ImageDataParameter::Clear();
    }
    if (has_infogain_loss_param()) {
      GOOGLE_DCHECK(infogain_loss_param_ != NULL);
      infogain_loss_param_->::caffe::InfogainLossParameter::Clear();
    }
    if (has_inner_product_param()) {
      GOOGLE_DCHECK(inner_product_param_ != NULL);
      inner_product_param_->::caffe::InnerProductParameter::Clear();
    }
    if (has_lrn_param()) {
      GOOGLE_DCHECK(lrn_param_ != NULL);
      lrn_param_->::caffe::LRNParameter::Clear();
    }
    if (has_memory_data_param()) {
      GOOGLE_DCHECK(memory_data_param_ != NULL);
      memory_data_param_->::caffe::MemoryDataParameter::Clear();
    }
    if (has_mvn_param()) {
      GOOGLE_DCHECK(mvn_param_ != NULL);
      mvn_param_->::caffe::MVNParameter::Clear();
    }
    if (has_pooling_param()) {
      GOOGLE_DCHECK(pooling_param_ != NULL);
      pooling_param_->::caffe::PoolingParameter::Clear();
    }
  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    if (has_power_param()) {
      GOOGLE_DCHECK(power_param_ != NULL);
      power_param_->::caffe::PowerParameter::Clear();
    }
    if (has_relu_param()) {
      GOOGLE_DCHECK(relu_param_ != NULL);
      relu_param_->::caffe::ReLUParameter::Clear();
    }
    if (has_sigmoid_param()) {
      GOOGLE_DCHECK(sigmoid_param_ != NULL);
      sigmoid_param_->::caffe::SigmoidParameter::Clear();
    }
    if (has_softmax_param()) {
      GOOGLE_DCHECK(softmax_param_ != NULL);
      softmax_param_->::caffe::SoftmaxParameter::Clear();
    }
    if (has_slice_param()) {
      GOOGLE_DCHECK(slice_param_ != NULL);
      slice_param_->::caffe::SliceParameter::Clear();
    }
    if (has_tanh_param()) {
      GOOGLE_DCHECK(tanh_param_ != NULL);
      tanh_param_->::caffe::TanHParameter::Clear();
    }
    if (has_threshold_param()) {
      GOOGLE_DCHECK(threshold_param_ != NULL);
      threshold_param_->::caffe::ThresholdParameter::Clear();
    }
    if (has_window_data_param()) {
      GOOGLE_DCHECK(window_data_param_ != NULL);
      window_data_param_->::caffe::WindowDataParameter::Clear();
    }
  }
  if (_has_bits_[32 / 32] & 255u) {
    if (has_python_param()) {
      GOOGLE_DCHECK(python_param_ != NULL);
      python_param_->::caffe::PythonParameter::Clear();
    }
    if (has_prelu_param()) {
      GOOGLE_DCHECK(prelu_param_ != NULL);
      prelu_param_->::caffe::PReLUParameter::Clear();
    }
    if (has_spp_param()) {
      GOOGLE_DCHECK(spp_param_ != NULL);
      spp_param_->::caffe::SPPParameter::Clear();
    }
    if (has_reshape_param()) {
      GOOGLE_DCHECK(reshape_param_ != NULL);
      reshape_param_->::caffe::ReshapeParameter::Clear();
    }
    if (has_log_param()) {
      GOOGLE_DCHECK(log_param_ != NULL);
      log_param_->::caffe::LogParameter::Clear();
    }
    if (has_flatten_param()) {
      GOOGLE_DCHECK(flatten_param_ != NULL);
      flatten_param_->::caffe::FlattenParameter::Clear();
    }
    if (has_reduction_param()) {
      GOOGLE_DCHECK(reduction_param_ != NULL);
      reduction_param_->::caffe::ReductionParameter::Clear();
    }
    if (has_embed_param()) {
      GOOGLE_DCHECK(embed_param_ != NULL);
      embed_param_->::caffe::EmbedParameter::Clear();
    }
  }
  if (_has_bits_[40 / 32] & 65280u) {
    if (has_tile_param()) {
      GOOGLE_DCHECK(tile_param_ != NULL);
      tile_param_->::caffe::TileParameter::Clear();
    }
    if (has_batch_norm_param()) {
      GOOGLE_DCHECK(batch_norm_param_ != NULL);
      batch_norm_param_->::caffe::BatchNormParameter::Clear();
    }
    if (has_elu_param()) {
      GOOGLE_DCHECK(elu_param_ != NULL);
      elu_param_->::caffe::ELUParameter::Clear();
    }
    if (has_bias_param()) {
      GOOGLE_DCHECK(bias_param_ != NULL);
      bias_param_->::caffe::BiasParameter::Clear();
    }
    if (has_scale_param()) {
      GOOGLE_DCHECK(scale_param_ != NULL);
      scale_param_->::caffe::ScaleParameter::Clear();
    }
    if (has_input_param()) {
      GOOGLE_DCHECK(input_param_ != NULL);
      input_param_->::caffe::InputParameter::Clear();
    }
    if (has_crop_param()) {
      GOOGLE_DCHECK(crop_param_ != NULL);
      crop_param_->::caffe::CropParameter::Clear();
    }
    if (has_parameter_param()) {
      GOOGLE_DCHECK(parameter_param_ != NULL);
      parameter_param_->::caffe::ParameterParameter::Clear();
    }
  }
  if (has_recurrent_param()) {
    GOOGLE_DCHECK(recurrent_param_ != NULL);
    recurrent_param_->::caffe::RecurrentParameter::Clear();
  }
  phase_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}